

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError PaAlsaStreamComponent_FinishConfigure
                  (PaAlsaStreamComponent *self,snd_pcm_hw_params_t *hwParams,
                  PaStreamParameters *params,int primeBuffers,double sampleRate,PaTime *latency)

{
  snd_pcm_t *psVar1;
  snd_pcm_uframes_t sVar2;
  undefined8 uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  size_t __n;
  long lVar7;
  pthread_t pVar9;
  char *pcVar10;
  char *errorText;
  undefined1 *__s;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uStack_60;
  undefined1 auStack_58 [8];
  ulong local_50;
  undefined8 local_48;
  snd_pcm_uframes_t boundary;
  double local_38;
  ulong uVar8;
  
  *latency = -1.0;
  uStack_60 = 0x110717;
  boundary = (snd_pcm_uframes_t)latency;
  local_38 = sampleRate;
  __n = snd_pcm_sw_params_sizeof();
  lVar4 = -(__n + 0xf & 0xfffffffffffffff0);
  __s = auStack_58 + lVar4;
  *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110735;
  memset(__s,0,__n);
  auVar12._0_8_ = (double)CONCAT44(0x43300000,(int)self->framesPerPeriod);
  auVar12._8_4_ = (int)(self->framesPerPeriod >> 0x20);
  auVar12._12_4_ = 0x45300000;
  dVar11 = params->suggestedLatency * local_38 +
           (auVar12._8_8_ - 1.9342813113834067e+25) + (auVar12._0_8_ - 4503599627370496.0);
  local_50 = (ulong)dVar11;
  local_50 = (long)(dVar11 - 9.223372036854776e+18) & (long)local_50 >> 0x3f | local_50;
  psVar1 = self->pcm;
  *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110796;
  iVar5 = snd_pcm_hw_params_set_buffer_size_near(psVar1,hwParams);
  if (iVar5 < 0) {
    *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110919;
    pVar9 = pthread_self();
    *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x11092b;
    iVar6 = pthread_equal(pVar9,paUnixMainThread);
    if (iVar6 != 0) {
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x11093a;
      pcVar10 = (char *)snd_strerror(iVar5);
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 8;
      uVar3 = *(undefined8 *)(auStack_58 + lVar4 + -8);
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110948;
      PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar3,(long)iVar5,pcVar10);
    }
    pcVar10 = 
    "Expression \'alsa_snd_pcm_hw_params_set_buffer_size_near( self->pcm, hwParams, &bufSz )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2145\n"
    ;
    goto LAB_00110c32;
  }
  psVar1 = self->pcm;
  *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x1107aa;
  iVar5 = snd_pcm_hw_params(psVar1,hwParams);
  if (iVar5 < 0) {
    *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x11095c;
    pVar9 = pthread_self();
    *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x11096e;
    iVar6 = pthread_equal(pVar9,paUnixMainThread);
    if (iVar6 != 0) {
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x11097d;
      pcVar10 = (char *)snd_strerror(iVar5);
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 8;
      uVar3 = *(undefined8 *)(auStack_58 + lVar4 + -8);
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x11098b;
      PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar3,(long)iVar5,pcVar10);
    }
    pcVar10 = 
    "Expression \'r\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2158\n"
    ;
    goto LAB_00110c32;
  }
  if (alsa_snd_pcm_hw_params_get_buffer_size == (undefined1 *)0x0) {
    self->alsaBufferSize = local_50;
    uVar8 = local_50;
  }
  else {
    *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x1107ce;
    iVar5 = snd_pcm_hw_params_get_buffer_size(hwParams,&self->alsaBufferSize);
    if (iVar5 < 0) {
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110b70;
      pVar9 = pthread_self();
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110b82;
      iVar6 = pthread_equal(pVar9,paUnixMainThread);
      if (iVar6 != 0) {
        *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110b91;
        pcVar10 = (char *)snd_strerror(iVar5);
        *(undefined8 *)(auStack_58 + lVar4 + -8) = 8;
        uVar3 = *(undefined8 *)(auStack_58 + lVar4 + -8);
        *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110b9f;
        PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar3,(long)iVar5,pcVar10);
      }
      pcVar10 = 
      "Expression \'alsa_snd_pcm_hw_params_get_buffer_size( hwParams, &self->alsaBufferSize )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2162\n"
      ;
      goto LAB_00110c32;
    }
    uVar8 = self->alsaBufferSize;
  }
  lVar7 = uVar8 - self->framesPerPeriod;
  auVar13._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar13._0_8_ = lVar7;
  auVar13._12_4_ = 0x45300000;
  *(double *)boundary =
       ((auVar13._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) / local_38;
  psVar1 = self->pcm;
  *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110825;
  iVar5 = snd_pcm_sw_params_current(psVar1,__s);
  if (iVar5 < 0) {
    *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x11099f;
    pVar9 = pthread_self();
    *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x1109b1;
    iVar6 = pthread_equal(pVar9,paUnixMainThread);
    if (iVar6 != 0) {
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x1109c0;
      pcVar10 = (char *)snd_strerror(iVar5);
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 8;
      uVar3 = *(undefined8 *)(auStack_58 + lVar4 + -8);
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x1109ce;
      PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar3,(long)iVar5,pcVar10);
    }
    pcVar10 = 
    "Expression \'alsa_snd_pcm_sw_params_current( self->pcm, swParams )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2173\n"
    ;
    goto LAB_00110c32;
  }
  psVar1 = self->pcm;
  sVar2 = self->framesPerPeriod;
  *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x11083d;
  iVar5 = snd_pcm_sw_params_set_start_threshold(psVar1,__s,sVar2);
  if (iVar5 < 0) {
    *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x1109e2;
    pVar9 = pthread_self();
    *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x1109f4;
    iVar6 = pthread_equal(pVar9,paUnixMainThread);
    if (iVar6 != 0) {
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110a03;
      pcVar10 = (char *)snd_strerror(iVar5);
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 8;
      uVar3 = *(undefined8 *)(auStack_58 + lVar4 + -8);
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110a11;
      PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar3,(long)iVar5,pcVar10);
    }
    pcVar10 = 
    "Expression \'alsa_snd_pcm_sw_params_set_start_threshold( self->pcm, swParams, self->framesPerPeriod )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2175\n"
    ;
    goto LAB_00110c32;
  }
  psVar1 = self->pcm;
  sVar2 = self->alsaBufferSize;
  *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110855;
  iVar5 = snd_pcm_sw_params_set_stop_threshold(psVar1,__s,sVar2);
  if (iVar5 < 0) {
    *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110a25;
    pVar9 = pthread_self();
    *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110a37;
    iVar6 = pthread_equal(pVar9,paUnixMainThread);
    if (iVar6 != 0) {
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110a46;
      pcVar10 = (char *)snd_strerror(iVar5);
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 8;
      uVar3 = *(undefined8 *)(auStack_58 + lVar4 + -8);
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110a54;
      PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar3,(long)iVar5,pcVar10);
    }
    pcVar10 = 
    "Expression \'alsa_snd_pcm_sw_params_set_stop_threshold( self->pcm, swParams, self->alsaBufferSize )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2176\n"
    ;
    goto LAB_00110c32;
  }
  if (primeBuffers == 0) {
    *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x11086e;
    iVar5 = snd_pcm_sw_params_get_boundary(__s,&local_48);
    if (iVar5 < 0) {
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110bb3;
      pVar9 = pthread_self();
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110bc5;
      iVar6 = pthread_equal(pVar9,paUnixMainThread);
      pcVar10 = 
      "Expression \'alsa_snd_pcm_sw_params_get_boundary( swParams, &boundary )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2182\n"
      ;
    }
    else {
      psVar1 = self->pcm;
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110884;
      iVar5 = snd_pcm_sw_params_set_silence_threshold(psVar1,__s,0);
      if (iVar5 < 0) {
        *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110bd6;
        pVar9 = pthread_self();
        *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110be8;
        iVar6 = pthread_equal(pVar9,paUnixMainThread);
        pcVar10 = 
        "Expression \'alsa_snd_pcm_sw_params_set_silence_threshold( self->pcm, swParams, 0 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2183\n"
        ;
      }
      else {
        psVar1 = self->pcm;
        *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x11089c;
        iVar5 = snd_pcm_sw_params_set_silence_size(psVar1,__s,local_48);
        if (-1 < iVar5) goto LAB_001108a4;
        *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110bf9;
        pVar9 = pthread_self();
        *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110c0b;
        iVar6 = pthread_equal(pVar9,paUnixMainThread);
        pcVar10 = 
        "Expression \'alsa_snd_pcm_sw_params_set_silence_size( self->pcm, swParams, boundary )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2184\n"
        ;
      }
    }
    if (iVar6 != 0) {
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110c21;
      errorText = (char *)snd_strerror(iVar5);
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 8;
      uVar3 = *(undefined8 *)(auStack_58 + lVar4 + -8);
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110c2f;
      PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar3,(long)iVar5,errorText);
    }
  }
  else {
LAB_001108a4:
    psVar1 = self->pcm;
    sVar2 = self->framesPerPeriod;
    *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x1108b4;
    iVar5 = snd_pcm_sw_params_set_avail_min(psVar1,__s,sVar2);
    if (iVar5 < 0) {
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110a68;
      pVar9 = pthread_self();
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110a7a;
      iVar6 = pthread_equal(pVar9,paUnixMainThread);
      if (iVar6 != 0) {
        *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110a89;
        pcVar10 = (char *)snd_strerror(iVar5);
        *(undefined8 *)(auStack_58 + lVar4 + -8) = 8;
        uVar3 = *(undefined8 *)(auStack_58 + lVar4 + -8);
        *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110a97;
        PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar3,(long)iVar5,pcVar10);
      }
      pcVar10 = 
      "Expression \'alsa_snd_pcm_sw_params_set_avail_min( self->pcm, swParams, self->framesPerPeriod )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2187\n"
      ;
    }
    else {
      psVar1 = self->pcm;
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 1;
      uVar3 = *(undefined8 *)(auStack_58 + lVar4 + -8);
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x1108cb;
      iVar5 = snd_pcm_sw_params_set_xfer_align(psVar1,__s,uVar3);
      if (iVar5 < 0) {
        *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110aab;
        pVar9 = pthread_self();
        *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110abd;
        iVar6 = pthread_equal(pVar9,paUnixMainThread);
        if (iVar6 != 0) {
          *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110acc;
          pcVar10 = (char *)snd_strerror(iVar5);
          *(undefined8 *)(auStack_58 + lVar4 + -8) = 8;
          uVar3 = *(undefined8 *)(auStack_58 + lVar4 + -8);
          *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110ada;
          PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar3,(long)iVar5,pcVar10);
        }
        pcVar10 = 
        "Expression \'alsa_snd_pcm_sw_params_set_xfer_align( self->pcm, swParams, 1 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2188\n"
        ;
      }
      else {
        psVar1 = self->pcm;
        *(undefined8 *)(auStack_58 + lVar4 + -8) = 1;
        uVar3 = *(undefined8 *)(auStack_58 + lVar4 + -8);
        *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x1108e2;
        iVar5 = snd_pcm_sw_params_set_tstamp_mode(psVar1,__s,uVar3);
        if (iVar5 < 0) {
          *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110aee;
          pVar9 = pthread_self();
          *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110b00;
          iVar6 = pthread_equal(pVar9,paUnixMainThread);
          if (iVar6 != 0) {
            *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110b0f;
            pcVar10 = (char *)snd_strerror(iVar5);
            *(undefined8 *)(auStack_58 + lVar4 + -8) = 8;
            uVar3 = *(undefined8 *)(auStack_58 + lVar4 + -8);
            *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110b1d;
            PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar3,(long)iVar5,pcVar10);
          }
          pcVar10 = 
          "Expression \'alsa_snd_pcm_sw_params_set_tstamp_mode( self->pcm, swParams, SND_PCM_TSTAMP_MMAP )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2189\n"
          ;
        }
        else {
          psVar1 = self->pcm;
          *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x1108f6;
          iVar5 = snd_pcm_sw_params(psVar1,__s);
          if (-1 < iVar5) {
            return 0;
          }
          *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110b2e;
          pVar9 = pthread_self();
          *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110b40;
          iVar6 = pthread_equal(pVar9,paUnixMainThread);
          if (iVar6 != 0) {
            *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110b4e;
            pcVar10 = (char *)snd_strerror(iVar5);
            *(undefined8 *)(auStack_58 + lVar4 + -8) = 8;
            uVar3 = *(undefined8 *)(auStack_58 + lVar4 + -8);
            *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110b5c;
            PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar3,(long)iVar5,pcVar10);
          }
          pcVar10 = 
          "Expression \'alsa_snd_pcm_sw_params( self->pcm, swParams )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2192\n"
          ;
        }
      }
    }
  }
LAB_00110c32:
  *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x110c39;
  PaUtil_DebugPrint(pcVar10);
  return -9999;
}

Assistant:

static PaError PaAlsaStreamComponent_FinishConfigure( PaAlsaStreamComponent *self, snd_pcm_hw_params_t* hwParams,
        const PaStreamParameters *params, int primeBuffers, double sampleRate, PaTime* latency )
{
    PaError result = paNoError;
    snd_pcm_sw_params_t* swParams;
    snd_pcm_uframes_t bufSz = 0;
    *latency = -1.;

    alsa_snd_pcm_sw_params_alloca( &swParams );

    bufSz = params->suggestedLatency * sampleRate + self->framesPerPeriod;
    ENSURE_( alsa_snd_pcm_hw_params_set_buffer_size_near( self->pcm, hwParams, &bufSz ), paUnanticipatedHostError );

    /* Set the parameters! */
    {
        int r = alsa_snd_pcm_hw_params( self->pcm, hwParams );
#ifdef PA_ENABLE_DEBUG_OUTPUT
        if( r < 0 )
        {
            snd_output_t *output = NULL;
            alsa_snd_output_stdio_attach( &output, stderr, 0 );
            alsa_snd_pcm_hw_params_dump( hwParams, output );
        }
#endif
        ENSURE_( r, paUnanticipatedHostError );
    }
    if( alsa_snd_pcm_hw_params_get_buffer_size != NULL )
    {
        ENSURE_( alsa_snd_pcm_hw_params_get_buffer_size( hwParams, &self->alsaBufferSize ), paUnanticipatedHostError );
    }
    else
    {
        self->alsaBufferSize = bufSz;
    }

    /* Latency in seconds */
    *latency = (self->alsaBufferSize - self->framesPerPeriod) / sampleRate;

    /* Now software parameters... */
    ENSURE_( alsa_snd_pcm_sw_params_current( self->pcm, swParams ), paUnanticipatedHostError );

    ENSURE_( alsa_snd_pcm_sw_params_set_start_threshold( self->pcm, swParams, self->framesPerPeriod ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_sw_params_set_stop_threshold( self->pcm, swParams, self->alsaBufferSize ), paUnanticipatedHostError );

    /* Silence buffer in the case of underrun */
    if( !primeBuffers ) /* XXX: Make sense? */
    {
        snd_pcm_uframes_t boundary;
        ENSURE_( alsa_snd_pcm_sw_params_get_boundary( swParams, &boundary ), paUnanticipatedHostError );
        ENSURE_( alsa_snd_pcm_sw_params_set_silence_threshold( self->pcm, swParams, 0 ), paUnanticipatedHostError );
        ENSURE_( alsa_snd_pcm_sw_params_set_silence_size( self->pcm, swParams, boundary ), paUnanticipatedHostError );
    }

    ENSURE_( alsa_snd_pcm_sw_params_set_avail_min( self->pcm, swParams, self->framesPerPeriod ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_sw_params_set_xfer_align( self->pcm, swParams, 1 ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_sw_params_set_tstamp_mode( self->pcm, swParams, SND_PCM_TSTAMP_MMAP ), paUnanticipatedHostError );

    /* Set the parameters! */
    ENSURE_( alsa_snd_pcm_sw_params( self->pcm, swParams ), paUnanticipatedHostError );

error:
    return result;
}